

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *this_00;
  int iVar1;
  Variant *pVVar2;
  size_t sVar3;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar4;
  TypedID<(diligent_spirv_cross::Types)0> TVar5;
  ulong uVar6;
  SPIRExpression *pSVar7;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar8;
  iterator iVar9;
  SPIRVariable *pSVar10;
  SPIRExpression *pSVar11;
  long lVar12;
  long lVar13;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar14;
  int iVar15;
  TypedID<(diligent_spirv_cross::Types)0> local_30;
  TypedID<(diligent_spirv_cross::Types)0> local_2c;
  
  uVar6 = (ulong)dst;
  local_30.id = source_expression;
  local_2c.id = dst;
  if ((uVar6 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
     (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
     pVVar2[uVar6].type == TypeExpression)) {
    pSVar7 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar2 + uVar6);
    if (((this->position_invariant == true) &&
        (uVar6 = (ulong)source_expression,
        uVar6 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size)) &&
       (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar2[uVar6].type == TypeExpression)) {
      Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar2 + uVar6);
      pTVar8 = (pSVar7->invariance_dependencies).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
      pTVar8 = ::std::
               __find_if<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                         (pTVar8,pTVar8 + (pSVar7->invariance_dependencies).
                                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                                          .buffer_size,&local_30);
      TVar5.id = local_30.id;
      sVar3 = (pSVar7->invariance_dependencies).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      if (pTVar8 == (pSVar7->invariance_dependencies).
                    super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                    .ptr + sVar3) {
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                  (&pSVar7->invariance_dependencies,sVar3 + 1);
        sVar3 = (pSVar7->invariance_dependencies).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                buffer_size;
        (pSVar7->invariance_dependencies).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr[sVar3].
        id = TVar5.id;
        (pSVar7->invariance_dependencies).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size
             = sVar3 + 1;
      }
    }
  }
  else {
    pSVar7 = (SPIRExpression *)0x0;
  }
  iVar9 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->forwarded_temporaries)._M_h,&local_2c.id);
  if ((iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) &&
     (iVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->forced_temporaries)._M_h,&local_2c.id),
     iVar9.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) {
    uVar6 = (ulong)local_30.id;
    if ((uVar6 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
       ((pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
        pVVar2[uVar6].type == TypeVariable &&
        (pSVar10 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + uVar6),
        TVar5.id = local_2c.id, pSVar10->phi_variable == true)))) {
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                (&pSVar10->dependees,
                 (pSVar10->dependees).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 buffer_size + 1);
      sVar3 = (pSVar10->dependees).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      (pSVar10->dependees).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr[sVar3].id
           = TVar5.id;
      (pSVar10->dependees).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size =
           sVar3 + 1;
    }
    uVar6 = (ulong)local_30.id;
    if ((uVar6 < (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size) &&
       (pVVar2 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar2[uVar6].type == TypeExpression)) {
      pSVar11 = Variant::get<diligent_spirv_cross::SPIRExpression>(pVVar2 + uVar6);
      TVar5.id = local_30.id;
      this_00 = &pSVar7->expression_dependencies;
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                (this_00,(pSVar7->expression_dependencies).
                         super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         .buffer_size + 1);
      sVar3 = (pSVar7->expression_dependencies).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      pTVar8 = (pSVar7->expression_dependencies).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr
               + sVar3;
      pTVar8->id = TVar5.id;
      (pSVar7->expression_dependencies).
      super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size =
           sVar3 + 1;
      pTVar14 = (pSVar11->expression_dependencies).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr
      ;
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::insert
                (this_00,pTVar8 + 1,pTVar14,
                 pTVar14 + (pSVar11->expression_dependencies).
                           super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                           .buffer_size);
      pTVar8 = (pSVar7->expression_dependencies).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
      uVar6 = (pSVar7->expression_dependencies).
              super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
              buffer_size;
      pTVar14 = pTVar8;
      if (uVar6 != 0) {
        lVar12 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        ::std::
        __introsort_loop<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar8,pTVar8 + uVar6,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
        ::std::
        __final_insertion_sort<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                  (pTVar8,pTVar8 + uVar6);
        pTVar4 = (pSVar7->expression_dependencies).
                 super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                 ptr;
        sVar3 = (pSVar7->expression_dependencies).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                buffer_size;
        pTVar8 = pTVar4 + sVar3;
        pTVar14 = pTVar8;
        if (sVar3 != 0) {
          lVar12 = 4;
          do {
            lVar13 = lVar12;
            if (sVar3 << 2 == lVar13) goto LAB_007aabf6;
            iVar15 = *(int *)((long)&pTVar4[-1].id + lVar13);
            lVar12 = lVar13 + 4;
          } while (iVar15 != *(int *)((long)&pTVar4->id + lVar13));
          lVar13 = (long)&pTVar4[-1].id + lVar13;
          for (; sVar3 << 2 != lVar12; lVar12 = lVar12 + 4) {
            iVar1 = *(int *)((long)&pTVar4->id + lVar12);
            if (iVar15 != iVar1) {
              *(int *)(lVar13 + 4) = iVar1;
              lVar13 = lVar13 + 4;
            }
            iVar15 = iVar1;
          }
          pTVar14 = (TypedID<(diligent_spirv_cross::Types)0> *)(lVar13 + 4);
        }
      }
LAB_007aabf6:
      SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::erase
                (this_00,pTVar14,pTVar8);
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	auto *ptr_e = maybe_get<SPIRExpression>(dst);

	if (is_position_invariant() && ptr_e && maybe_get<SPIRExpression>(source_expression))
	{
		auto &deps = ptr_e->invariance_dependencies;
		if (std::find(deps.begin(), deps.end(), source_expression) == deps.end())
			deps.push_back(source_expression);
	}

	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = *ptr_e;
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}